

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall helics::CoreBroker::fedRegistration(CoreBroker *this,ActionMessage *command)

{
  DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
  *pDVar1;
  uint16_t uVar2;
  ushort uVar3;
  GlobalFederateId federateID;
  pointer pBVar4;
  BaseTimeCoordinator *pBVar5;
  pointer pcVar6;
  size_type sVar7;
  bool bVar8;
  string_view message;
  byte *__src;
  route_id rVar9;
  iterator iVar10;
  pointer pBVar11;
  BasicFedInfo *fed;
  int iVar12;
  int32_t iVar13;
  size_t sVar14;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  bool bVar15;
  bool bVar16;
  string_view name;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>,_bool>
  pVar17;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false,_false>,_bool>
  pVar18;
  string_view fmt;
  format_args args;
  GlobalFederateId global_fedid;
  route_id route_id;
  string_view fedName;
  ActionMessage noInit;
  ActionMessage fedEnableProfiling;
  GlobalFederateId local_1e8;
  uint local_1e4;
  size_t local_1e0;
  byte *pbStack_1d8;
  string local_1d0;
  size_t local_1b0;
  char *pcStack_1a8;
  undefined1 local_1a0 [16];
  GlobalFederateId local_190;
  ushort local_186;
  SmallBuffer local_160;
  ActionMessage local_e8;
  
  if ((this->super_BrokerBase).field_0x295 == '\0') {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>(&this->earlyMessages,command);
    return;
  }
  uVar2 = command->flags;
  if (-1 < (short)uVar2) {
    iVar12 = 0;
    for (pBVar11 = (this->mFederates).dataStorage.
                   super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        pBVar11 !=
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish; pBVar11 = pBVar11 + 1) {
      iVar12 = iVar12 + (pBVar11->nonCounting ^ 1);
    }
    if ((this->super_BrokerBase).maxFederateCount <= iVar12) {
      iVar13 = 0xb;
      goto LAB_002e500f;
    }
  }
  if ((this->super_BrokerBase).brokerState._M_i < OPERATING) {
    if ((-1 < (short)uVar2) && (bVar15 = allInitReady(this), bVar15)) {
      ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_init_not_ready);
      local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,(ActionMessage *)local_1a0);
      ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
    }
    bVar15 = false;
  }
  else {
    if ((this->super_BrokerBase).brokerState._M_i != OPERATING) {
      iVar13 = 0xe;
LAB_002e500f:
      sendFedErrorAck(this,command,iVar13);
      return;
    }
    bVar15 = true;
    if ((-1 < (short)uVar2) && ((this->super_BrokerBase).dynamicFederation == false)) {
      bVar15 = (bool)(*(byte *)((long)&command->flags + 1) & 1);
    }
    if (bVar15 == false) {
      iVar13 = 5;
      goto LAB_002e500f;
    }
  }
  local_1e0 = (command->payload).bufferSize;
  pbStack_1d8 = (command->payload).heap;
  bVar16 = true;
  if ((bVar15 != false) && ((command->flags & 0x400) != 0)) {
    local_1a0._0_8_ = local_1e0;
    local_1a0._8_8_ = pbStack_1d8;
    iVar10 = std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&(this->mFederates).lookup1,(key_type *)local_1a0);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar11 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar11 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_start +
                *(long *)((long)iVar10.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x18);
    }
    bVar8 = true;
    bVar16 = pBVar11 ==
             (this->mFederates).dataStorage.
             super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (!bVar16) {
      if (pBVar11->reentrant == true) {
        rVar9 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
        (pBVar11->route).rid = rVar9.rid;
        (pBVar11->parent).gid = (command->source_id).gid;
        pBVar11->state = CONNECTED;
        bVar16 = false;
      }
      else {
        sendFedErrorAck(this,command,6);
        bVar16 = true;
        bVar8 = false;
      }
    }
    if (!bVar8) {
      return;
    }
  }
  if (bVar16) {
    pDVar1 = &this->mFederates;
    local_1a0._0_8_ = local_1e0;
    local_1a0._8_8_ = pbStack_1d8;
    iVar10 = std::
             _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)&(this->mFederates).lookup1,(key_type *)local_1a0);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar11 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      pBVar11 = (pDVar1->dataStorage).
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_start +
                *(long *)((long)iVar10.
                                super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                ._M_cur + 0x18);
    }
    if (pBVar11 !=
        (this->mFederates).dataStorage.
        super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      iVar13 = 6;
LAB_002e50d6:
      sendFedErrorAck(this,command,iVar13);
      return;
    }
    gmlc::containers::
    DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>::
    insert<std::basic_string_view<char,std::char_traits<char>>&>
              ((DualStringMappedVector<helics::BasicFedInfo,helics::GlobalFederateId,(reference_stability)1,5>
                *)pDVar1,local_1e0,pbStack_1d8);
    rVar9 = getRoute(this,(GlobalFederateId)(command->source_id).gid);
    pBVar11 = (this->mFederates).dataStorage.
              super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pBVar11[-1].route.rid = rVar9.rid;
    pBVar11[-1].parent.gid = (command->source_id).gid;
    uVar3 = command->flags;
    if ((short)uVar3 < 0) {
      pBVar11[-1].nonCounting = true;
    }
    if ((uVar3 >> 8 & 1) != 0) {
      pBVar11[-1].observer = true;
    }
    if ((uVar3 >> 10 & 1) != 0) {
      pBVar11[-1].reentrant = true;
    }
    pBVar11[-1].dynamic = bVar15;
    pBVar4 = (pDVar1->dataStorage).
             super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl
             .super__Vector_impl_data._M_start;
    sVar14 = ((long)pBVar11 - (long)pBVar4 >> 3) * 0x6db6db6db6db6db7 - 1;
    if ((uVar3 >> 0xe & 1) == 0) {
      if ((this->super_BrokerBase).field_0x294 == '\x01') {
        iVar12 = 0;
        if ((ushort)(command->counter - 1) < 0x10) {
          iVar12 = (uint)command->counter * 100000000;
        }
        pBVar11[-1].global_id.gid = (int)sVar14 + iVar12 + 0x20000;
        local_1a0._0_8_ = sVar14;
        if (pBVar11 != pBVar4) {
          std::
          _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<helics::GlobalFederateId_const&,unsigned_long&>
                    ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&(this->mFederates).lookup2,&pBVar11[-1].global_id,local_1a0);
        }
      }
    }
    else {
      pBVar11[-1].global_id.gid = (command->dest_handle).hid;
      local_1a0._0_8_ = sVar14;
      if ((pBVar11 == pBVar4) ||
         (pVar17 = std::
                   _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                   ::_M_emplace<helics::GlobalFederateId_const&,unsigned_long&>
                             ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,unsigned_long>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                               *)&(this->mFederates).lookup2,&pBVar11[-1].global_id,local_1a0),
         ((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)) {
        iVar13 = 0x11;
        goto LAB_002e50d6;
      }
    }
  }
  if ((this->super_BrokerBase).field_0x294 == '\0') {
    iVar12 = (this->super_BrokerBase).global_broker_id_local.gid;
    if ((iVar12 == -2010000000) || (iVar12 == -1700000000)) {
      gmlc::containers::SimpleQueue<helics::ActionMessage,std::mutex>::push<helics::ActionMessage&>
                ((SimpleQueue<helics::ActionMessage,std::mutex> *)&this->delayTransmitQueue,command)
      ;
    }
    else {
      (command->source_id).gid = iVar12;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,0,command);
    }
  }
  else {
    if (bVar16) {
      pBVar11 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
    }
    else {
      local_1a0._0_8_ = local_1e0;
      local_1a0._8_8_ = pbStack_1d8;
      iVar10 = std::
               _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&(this->mFederates).lookup1,(key_type *)local_1a0);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar11 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar11 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                  ._M_cur + 0x18);
      }
    }
    local_1e4 = (pBVar11->route).rid;
    if (bVar16) {
      pBVar11 = (this->mFederates).dataStorage.
                super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish + -1;
    }
    else {
      local_1a0._0_8_ = local_1e0;
      local_1a0._8_8_ = pbStack_1d8;
      iVar10 = std::
               _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&(this->mFederates).lookup1,(key_type *)local_1a0);
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
          ._M_cur == (__node_type *)0x0) {
        pBVar11 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        pBVar11 = (this->mFederates).dataStorage.
                  super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>.
                  _M_impl.super__Vector_impl_data._M_start +
                  *(long *)((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                                  ._M_cur + 0x18);
      }
    }
    local_1e8.gid = (pBVar11->global_id).gid;
    pVar18 = std::
             _Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
             ::_M_emplace<helics::GlobalFederateId&,helics::route_id&>
                       ((_Hashtable<helics::GlobalFederateId,std::pair<helics::GlobalFederateId_const,helics::route_id>,std::allocator<std::pair<helics::GlobalFederateId_const,helics::route_id>>,std::__detail::_Select1st,std::equal_to<helics::GlobalFederateId>,std::hash<helics::GlobalFederateId>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                         *)&this->routing_table,&local_1e8,&local_1e4);
    if (!bVar16 && ((undefined1  [16])pVar18 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      *(uint *)((long)pVar18.first.
                      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_helics::GlobalFederateId,_helics::route_id>,_false>
               + 0xc) = local_1e4;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_1a0,cmd_fed_ack);
    __src = pbStack_1d8;
    local_160.bufferSize = local_1e0;
    local_1a0._8_4_ = (this->super_BrokerBase).global_broker_id_local.gid;
    local_190.gid = local_1e8.gid;
    if (local_160.heap == pbStack_1d8) {
    }
    else {
      SmallBuffer::reserve(&local_160,local_1e0);
      if (local_160.bufferSize != 0) {
        memcpy(local_160.heap,__src,local_160.bufferSize);
      }
    }
    if ((command->flags >> 0xe & 1) != 0) {
      local_186 = local_186 | 0x4000;
    }
    if (((this->super_BrokerBase).globalTime != false) ||
       ((this->super_BrokerBase).asyncTime == true)) {
      uVar3 = local_186 | 0x20;
      if ((this->super_BrokerBase).asyncTime == true) {
        uVar3 = local_186 | 0xa0;
      }
      local_186 = uVar3;
      if (-1 < (short)command->flags) {
        pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar5->_vptr_BaseTimeCoordinator[4])(pBVar5,(ulong)(uint)local_1e8.gid);
        pBVar5 = (this->super_BrokerBase).timeCoord._M_t.
                 super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                 .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl;
        (*pBVar5->_vptr_BaseTimeCoordinator[5])(pBVar5,(ulong)(uint)local_1e8.gid);
        BaseTimeCoordinator::setAsChild
                  ((this->super_BrokerBase).timeCoord._M_t.
                   super___uniq_ptr_impl<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_helics::BaseTimeCoordinator_*,_std::default_delete<helics::BaseTimeCoordinator>_>
                   .super__Head_base<0UL,_helics::BaseTimeCoordinator_*,_false>._M_head_impl,
                   local_1e8);
      }
    }
    if ((this->super_BrokerBase).globalDisconnect == true) {
      local_186 = local_186 | 0x800;
    }
    (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4,local_1a0);
    if (8 < (this->super_BrokerBase).maxLogLevel.super___atomic_base<int>._M_i) {
      federateID.gid = (this->super_BrokerBase).global_broker_id_local.gid;
      pcVar6 = (this->super_BrokerBase).identifier._M_dataplus._M_p;
      sVar7 = (this->super_BrokerBase).identifier._M_string_length;
      local_e8._0_8_ = pbStack_1d8;
      local_e8.source_id.gid = (undefined4)local_1e0;
      local_e8.source_handle.hid = local_1e0._4_4_;
      local_e8.dest_id.gid = local_1e8.gid;
      local_e8.actionTime.internalTimeCode._0_4_ = local_1e4;
      fmt.size_ = 0x11d;
      fmt.data_ = (char *)0x27;
      args.field_1.args_ = in_R9.args_;
      args.desc_ = (unsigned_long_long)&local_e8;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_1d0,(v11 *)"registering federate {}({}) on route {}",fmt,args);
      local_1b0 = local_1d0._M_string_length;
      pcStack_1a8 = local_1d0._M_dataplus._M_p;
      message._M_str = local_1d0._M_dataplus._M_p;
      message._M_len = local_1d0._M_string_length;
      name._M_str = pcVar6;
      name._M_len = sVar7;
      BrokerBase::sendToLogger(&this->super_BrokerBase,federateID,9,name,message,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((this->super_BrokerBase).enable_profiling == true) {
      ActionMessage::ActionMessage
                (&local_e8,cmd_set_profiler_flag,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,local_1e8);
      local_e8.flags._0_1_ = (byte)local_e8.flags | 0x20;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4);
      ActionMessage::~ActionMessage(&local_e8);
    }
    if ((this->mNextTimeBarrier).internalTimeCode != 0x7fffffffffffffff) {
      ActionMessage::ActionMessage
                (&local_e8,cmd_time_barrier,
                 (GlobalFederateId)(this->super_BrokerBase).global_broker_id_local.gid,local_1e8);
      local_e8.actionTime.internalTimeCode = (this->mNextTimeBarrier).internalTimeCode;
      local_e8.messageID = (this->super_BrokerBase).global_broker_id_local.gid;
      (*(this->super_Broker)._vptr_Broker[0x22])(this,(ulong)local_1e4);
      ActionMessage::~ActionMessage(&local_e8);
    }
    ActionMessage::~ActionMessage((ActionMessage *)local_1a0);
  }
  return;
}

Assistant:

void CoreBroker::fedRegistration(ActionMessage&& command)
{
    if (!connectionEstablished) {
        earlyMessages.push_back(std::move(command));
        return;
    }
    const bool countable = !checkActionFlag(command, non_counting_flag);
    bool dynamicFed{false};
    if (countable && getCountableFederates() >= maxFederateCount) {
        sendFedErrorAck(command, max_federate_count_exceeded);
        return;
    }
    if (getBrokerState() < BrokerState::OPERATING) {
        if (countable && allInitReady()) {
            ActionMessage noInit(CMD_INIT_NOT_READY);
            noInit.source_id = global_broker_id_local;
            transmit(parent_route_id, noInit);
        }
    } else if (getBrokerState() == BrokerState::OPERATING) {
        const bool allowed =
            dynamicFederation || !countable || checkActionFlag(command, observer_flag);
        if (!allowed) {
            // we are initialized already
            sendFedErrorAck(command, already_init_error_code);
            return;
        }
        dynamicFed = true;
    } else {
        // we are in an ERROR_STATE and terminating
        sendFedErrorAck(command, broker_terminating);
        return;
    }
    auto fedName = command.name();
    bool newFed{true};
    if (dynamicFed && checkActionFlag(command, reentrant_flag)) {
        auto fedLoc = mFederates.find(fedName);
        if (fedLoc != mFederates.end()) {
            if (fedLoc->reentrant) {
                fedLoc->route = getRoute(command.source_id);
                fedLoc->parent = command.source_id;
                fedLoc->state = ConnectionState::CONNECTED;
                newFed = false;
            } else {
                sendFedErrorAck(command, duplicate_federate_name_error_code);
                return;
            }
        }
    }

    if (newFed) {
        // this checks for duplicate federate names
        if (mFederates.find(fedName) != mFederates.end()) {
            sendFedErrorAck(command, duplicate_federate_name_error_code);
            return;
        }
        mFederates.insert(fedName, no_search, fedName);
        mFederates.back().route = getRoute(command.source_id);
        mFederates.back().parent = command.source_id;
        if (checkActionFlag(command, non_counting_flag)) {
            mFederates.back().nonCounting = true;
        }
        if (checkActionFlag(command, observer_flag)) {
            mFederates.back().observer = true;
        }
        if (checkActionFlag(command, reentrant_flag)) {
            mFederates.back().reentrant = true;
        }
        mFederates.back().dynamic = dynamicFed;
        auto lookupIndex = mFederates.size() - 1;
        if (checkActionFlag(command, child_flag)) {
            mFederates.back().global_id = GlobalFederateId(command.getExtraData());
            if (!mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex)) {
                sendFedErrorAck(command, duplicate_federate_id);
                return;
            }
        } else if (isRootc) {
            if (command.counter > 0 && command.counter <= 16) {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift +
                    command.counter * gGlobalPriorityBlockSize);
            } else {
                mFederates.back().global_id = GlobalFederateId(
                    static_cast<GlobalFederateId::BaseType>(lookupIndex) + gGlobalFederateIdShift);
            }
            mFederates.addSearchTermForIndex(mFederates.back().global_id, lookupIndex);
        }
    }

    if (!isRootc) {
        if (global_broker_id_local.isValid()) {
            command.source_id = global_broker_id_local;
            transmit(parent_route_id, command);
        } else {
            // delay the response if we are not fully registered yet
            delayTransmitQueue.push(command);
        }
    } else {
        auto route_id = (newFed) ? mFederates.back().route : mFederates.find(fedName)->route;
        auto global_fedid =
            (newFed) ? mFederates.back().global_id : mFederates.find(fedName)->global_id;
        auto res = routing_table.emplace(global_fedid, route_id);
        if (!res.second && !newFed) {
            res.first->second = route_id;
        }

        // don't bother with the federate_table
        // transmit the response
        ActionMessage fedReply(CMD_FED_ACK);
        fedReply.source_id = global_broker_id_local;
        fedReply.dest_id = global_fedid;
        fedReply.name(fedName);
        if (checkActionFlag(command, child_flag)) {
            setActionFlag(fedReply, child_flag);
        }
        if (globalTime || asyncTime) {
            setActionFlag(fedReply, global_timing_flag);
            if (asyncTime) {
                setActionFlag(fedReply, async_timing_flag);
            }
            if (!checkActionFlag(command, non_counting_flag)) {
                timeCoord->addDependency(global_fedid);
                timeCoord->addDependent(global_fedid);
                timeCoord->setAsChild(global_fedid);
            }
        }
        if (globalDisconnect) {
            setActionFlag(fedReply, global_disconnect_flag);
        }
        transmit(route_id, fedReply);
        LOG_CONNECTIONS(global_broker_id_local,
                        getIdentifier(),
                        fmt::format("registering federate {}({}) on route {}",
                                    fedName,
                                    global_fedid.baseValue(),
                                    route_id.baseValue()));
        if (enable_profiling) {
            ActionMessage fedEnableProfiling(CMD_SET_PROFILER_FLAG,
                                             global_broker_id_local,
                                             global_fedid);
            setActionFlag(fedEnableProfiling, indicator_flag);
            transmit(route_id, fedEnableProfiling);
        }
        if (mNextTimeBarrier < Time::maxVal()) {
            ActionMessage timeBarrier(CMD_TIME_BARRIER, global_broker_id_local, global_fedid);
            timeBarrier.actionTime = mNextTimeBarrier;
            timeBarrier.messageID = global_broker_id_local.baseValue();
            transmit(route_id, timeBarrier);
        }
    }
}